

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O2

int Abc_NtkRetimeIncremental
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fMinDelay,int fOneStep,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Abc_Ntk_t *pNtk_00;
  st__table *psVar7;
  Abc_Obj_t *pObj;
  int iVar8;
  int i;
  Abc_Ntk_t *local_40;
  Vec_Int_t *local_38;
  
  if (pNtk->nObjCounts[7] == 0) {
    return 0;
  }
  iVar1 = pNtk->nObjCounts[8];
  iVar6 = pNtk->vObjs->nSize;
  Abc_NtkOrderCisCos(pNtk);
  if (fMinDelay == 0) {
    iVar8 = -1;
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (fOneStep == 0) {
      iVar8 = Abc_NtkLevel(pNtk);
      iVar8 = iVar8 * 2;
    }
    else {
      iVar8 = 1;
    }
    pNtk_00 = Abc_NtkDup(pNtk);
    psVar7 = Abc_NtkRetimePrepareLatches(pNtk_00);
    st__free_table(psVar7);
  }
  psVar7 = Abc_NtkRetimePrepareLatches(pNtk);
  Abc_NtkRetimeShareLatches(pNtk,0);
  pVVar2 = pNtk->vBoxes;
  pNtk->vBoxes = (Vec_Ptr_t *)0x0;
  if (fMinDelay == 0) {
    if (fForward == 0) {
      local_38 = Abc_NtkRetimeCollectLatchValues(pNtk);
      local_40 = Abc_NtkRetimeBackwardInitialStart(pNtk);
    }
    else {
      Abc_NtkRetimeTranferToCopy(pNtk);
      local_38 = (Vec_Int_t *)0x0;
      local_40 = (Abc_Ntk_t *)0x0;
    }
    i = 0;
    bVar4 = false;
    iVar8 = 0;
    do {
      while (pNtk->vObjs->nSize <= i) {
        if (!bVar4) goto LAB_003d4cef;
        i = 0;
        bVar4 = false;
        if (9999 < iVar8) goto LAB_003d4cef;
      }
      pObj = Abc_NtkObj(pNtk,i);
      if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
         (iVar5 = Abc_NtkRetimeNodeIsEnabled(pObj,fForward), iVar5 != 0)) {
        bVar4 = true;
        Abc_NtkRetimeNode(pObj,fForward,1);
        bVar3 = 0x270e < iVar8;
        iVar8 = iVar8 + 1;
        if (bVar3) goto LAB_003d4ce1;
      }
      i = i + 1;
    } while( true );
  }
  Abc_NtkRetimeMinDelay(pNtk,pNtk_00,nDelayLim,iVar8,fForward,fVerbose);
  Abc_NtkDelete(pNtk_00);
LAB_003d4d30:
  iVar8 = 0;
  Abc_NtkRetimeShareLatches(pNtk,0);
  pNtk->vBoxes = pVVar2;
  iVar6 = Abc_NtkRetimeFinalizeLatches(pNtk,psVar7,iVar6);
  st__free_table(psVar7);
  if (iVar6 != 0) {
    iVar6 = Abc_NtkCheck(pNtk);
    if (iVar6 == 0) {
      fwrite("Abc_NtkRetimeForward(): Network check has failed.\n",0x32,1,_stdout);
    }
    iVar8 = iVar1 - pNtk->nObjCounts[8];
  }
  return iVar8;
LAB_003d4ce1:
  printf("Stopped after %d latch moves.\n");
LAB_003d4cef:
  if (fForward == 0) {
    Abc_NtkRetimeBackwardInitialFinish(pNtk,local_40,local_38,fVerbose);
    Abc_NtkDelete(local_40);
    free(local_38->pArray);
    free(local_38);
  }
  else {
    Abc_NtkRetimeTranferFromCopy(pNtk);
  }
  goto LAB_003d4d30;
}

Assistant:

int Abc_NtkRetimeIncremental( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fMinDelay, int fOneStep, int fVerbose )
{
    Abc_Ntk_t * pNtkCopy = NULL;
    Vec_Ptr_t * vBoxes;
    st__table * tLatches;
    int nLatches = Abc_NtkLatchNum(pNtk);
    int nIdMaxStart = Abc_NtkObjNumMax(pNtk);
    int RetValue;
    int nIterLimit = -1; // Suppress "might be used uninitialized"
    if ( Abc_NtkNodeNum(pNtk) == 0 )
        return 0;
    // reorder CI/CO/latch inputs
    Abc_NtkOrderCisCos( pNtk );
    if ( fMinDelay ) 
    {
        nIterLimit = fOneStep? 1 : 2 * Abc_NtkLevel(pNtk);
        pNtkCopy = Abc_NtkDup( pNtk );
        tLatches = Abc_NtkRetimePrepareLatches( pNtkCopy );
        st__free_table( tLatches );
    }
    // collect latches and remove CIs/COs
    tLatches = Abc_NtkRetimePrepareLatches( pNtk );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // save boxes
    vBoxes = pNtk->vBoxes;  pNtk->vBoxes = NULL;
    // perform the retiming
    if ( fMinDelay )
        Abc_NtkRetimeMinDelay( pNtk, pNtkCopy, nDelayLim, nIterLimit, fForward, fVerbose );
    else
        Abc_NtkRetimeOneWay( pNtk, fForward, fVerbose );
    if ( fMinDelay ) 
        Abc_NtkDelete( pNtkCopy );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // restore boxes
    pNtk->vBoxes = vBoxes;
    // finalize the latches
    RetValue = Abc_NtkRetimeFinalizeLatches( pNtk, tLatches, nIdMaxStart );
    st__free_table( tLatches );
    if ( RetValue == 0 )
        return 0;
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeForward(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}